

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::module::add_object(module *this,char *name,object *obj,bool overwrite)

{
  PyObject *pPVar1;
  object *poVar2;
  bool bVar3;
  PyObject **ppPVar4;
  allocator local_91;
  string local_90 [32];
  char local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  PyObject *local_30;
  undefined1 local_21;
  handle *phStack_20;
  bool overwrite_local;
  object *obj_local;
  char *name_local;
  module *this_local;
  
  local_21 = overwrite;
  phStack_20 = &obj->super_handle;
  obj_local = (object *)name;
  name_local = (char *)this;
  if (!overwrite) {
    local_30 = (this->super_object).super_handle.m_ptr;
    bVar3 = hasattr((handle)local_30,name);
    poVar2 = obj_local;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,(char *)poVar2,&local_91);
      std::operator+(local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              "Error during initialization: multiple incompatible definitions with name \""
                    );
      std::operator+(local_50,local_70);
      pybind11_fail(local_50);
    }
  }
  handle::inc_ref(phStack_20);
  ppPVar4 = handle::ptr((handle *)this);
  poVar2 = obj_local;
  pPVar1 = *ppPVar4;
  ppPVar4 = handle::ptr(phStack_20);
  PyModule_AddObject(pPVar1,poVar2,*ppPVar4);
  return;
}

Assistant:

PYBIND11_NOINLINE void add_object(const char *name, object &obj, bool overwrite = false) {
        if (!overwrite && hasattr(*this, name))
            pybind11_fail("Error during initialization: multiple incompatible definitions with name \"" +
                    std::string(name) + "\"");

        obj.inc_ref(); // PyModule_AddObject() steals a reference
        PyModule_AddObject(ptr(), name, obj.ptr());
    }